

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int transfer_get_batchable(TRANSFER_HANDLE transfer,_Bool *batchable_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  undefined8 in_RAX;
  AMQP_VALUE value;
  uint32_t item_count;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  if (transfer == (TRANSFER_HANDLE)0x0) {
    return 0x1fc5;
  }
  iVar1 = amqpvalue_get_composite_item_count(transfer->composite_value,&local_14);
  if (iVar1 != 0) {
    return 0x1fcd;
  }
  if (((10 < local_14) &&
      (value = amqpvalue_get_composite_item_in_place(transfer->composite_value,10),
      value != (AMQP_VALUE)0x0)) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
    iVar1 = amqpvalue_get_boolean(value,batchable_value);
    if (iVar1 == 0) {
      return 0;
    }
    AVar2 = amqpvalue_get_type(value);
    if (AVar2 != AMQP_TYPE_NULL) {
      return 0x1fe6;
    }
  }
  *batchable_value = false;
  return 0;
}

Assistant:

int transfer_get_batchable(TRANSFER_HANDLE transfer, bool* batchable_value)
{
    int result;

    if (transfer == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        if (amqpvalue_get_composite_item_count(transfer_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 10)
            {
                *batchable_value = false;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(transfer_instance->composite_value, 10);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *batchable_value = false;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_boolean(item_value, batchable_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *batchable_value = false;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}